

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O1

void __thiscall bloaty::Regex::InternalSwap(Regex *this,Regex *other)

{
  InternalMetadataWithArena *this_00;
  uint32 uVar1;
  void *pvVar2;
  string *psVar3;
  ArenaStringPtr *pAVar4;
  UnknownFieldSet *other_00;
  
  this_00 = &other->_internal_metadata_;
  if ((((ulong)(this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_ & 1) != 0) ||
     (((ulong)(this_00->
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              ).ptr_ & 1) != 0)) {
    pvVar2 = (this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_;
    if (((ulong)pvVar2 & 1) == 0) {
      other_00 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 ::mutable_unknown_fields_slow
                           (&this_00->
                             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                           );
    }
    else {
      other_00 = (UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe);
    }
    google::protobuf::internal::InternalMetadataWithArena::DoSwap
              (&this->_internal_metadata_,other_00);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  pAVar4 = &other->pattern_;
  if ((this->pattern_).ptr_ ==
      (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar4->ptr_ == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
       ) goto LAB_00190096;
    google::protobuf::internal::ArenaStringPtr::CreateInstance
              (&this->pattern_,(Arena *)0x0,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  }
  psVar3 = (this->pattern_).ptr_;
  if (pAVar4->ptr_ == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
  {
    google::protobuf::internal::ArenaStringPtr::CreateInstance
              (pAVar4,(Arena *)0x0,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  }
  std::__cxx11::string::swap((string *)psVar3);
LAB_00190096:
  pAVar4 = &other->replacement_;
  if ((this->replacement_).ptr_ ==
      (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar4->ptr_ == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
       ) {
      return;
    }
    google::protobuf::internal::ArenaStringPtr::CreateInstance
              (&this->replacement_,(Arena *)0x0,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  }
  psVar3 = (this->replacement_).ptr_;
  if (pAVar4->ptr_ == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
  {
    google::protobuf::internal::ArenaStringPtr::CreateInstance
              (pAVar4,(Arena *)0x0,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  }
  std::__cxx11::string::swap((string *)psVar3);
  return;
}

Assistant:

void Regex::InternalSwap(Regex* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  pattern_.Swap(&other->pattern_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  replacement_.Swap(&other->replacement_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
}